

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4minput.c
# Opt level: O0

int parse_color_range(y4m_input *y4m_ctx,char *buf)

{
  int iVar1;
  char *in_RSI;
  long in_RDI;
  int local_4;
  
  iVar1 = strcmp(in_RSI,"LIMITED");
  if (iVar1 == 0) {
    local_4 = 1;
  }
  else {
    iVar1 = strcmp(in_RSI,"FULL");
    if (iVar1 == 0) {
      *(undefined4 *)(in_RDI + 0x84) = 1;
      local_4 = 1;
    }
    else {
      fprintf(_stderr,"Unknown color range value: %s\n",in_RSI);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int parse_color_range(y4m_input *y4m_ctx, const char *buf) {
  // Note that default is studio range.
  if (strcmp(buf, "LIMITED") == 0) {
    return 1;
  }
  if (strcmp(buf, "FULL") == 0) {
    y4m_ctx->color_range = AOM_CR_FULL_RANGE;
    return 1;
  }
  fprintf(stderr, "Unknown color range value: %s\n", buf);
  return 0;
}